

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadNodes<mapnode_t,mapsubsector_t>(MapData *map)

{
  ushort uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  mapnode_t *pmVar6;
  int num;
  FMemLump this;
  ulong uVar7;
  node_t *pnVar8;
  undefined1 *__s;
  ulong uVar9;
  undefined8 uStack_d0;
  undefined1 auStack_c8 [8];
  mapnode_t *local_c0;
  mapnode_t *local_b8;
  node_t *local_b0;
  mapnode_t *local_a8;
  node_t *local_a0;
  mapnode_t *local_98;
  node_t *local_90;
  DWORD local_84;
  node_t *local_80;
  node_t *local_78;
  DWORD local_70;
  DWORD local_6c;
  DWORD local_68;
  undefined4 local_64;
  int child;
  int maxss;
  DWORD local_4c;
  undefined1 *puStack_48;
  int lumplen;
  WORD *used;
  node_t *no;
  mapnode_t *mn;
  char *mnp;
  int local_20;
  int k;
  int j;
  int i;
  FMemLump data;
  MapData *map_local;
  
  __s = auStack_c8;
  uStack_d0 = 0x6c0f58;
  data.Block.Chars = (FString)(FString)map;
  FMemLump::FMemLump((FMemLump *)&j);
  uStack_d0 = 0x6c0f66;
  local_6c = MapData::Size((MapData *)data.Block.Chars,7);
  uStack_d0 = 0x6c0f7f;
  local_4c = local_6c;
  local_70 = MapData::Size((MapData *)data.Block.Chars,6);
  child = local_70 >> 2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)local_4c;
  numnodes = SUB164(auVar3 / ZEXT816(0x1c),0);
  if (((numnodes == 0) && (child != 1)) || (child == 0)) {
    ForceNodeBuild = true;
    local_64 = 1;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)numnodes;
    uVar7 = SUB168(auVar4 * ZEXT816(0x48),0);
    if (SUB168(auVar4 * ZEXT816(0x48),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    uStack_d0 = 0x6c100c;
    nodes = (node_t *)operator_new__(uVar7);
    lVar5 = -((long)numnodes * 2 + 0xfU & 0xfffffffffffffff0);
    __s = auStack_c8 + lVar5;
    local_78 = nodes;
    puStack_48 = __s;
    *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c104f;
    memset(__s,0,(long)numnodes * 2);
    uVar7 = (ulong)(int)local_4c;
    *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c1058;
    pnVar8 = (node_t *)operator_new__(uVar7);
    this = data;
    local_80 = pnVar8;
    no = pnVar8;
    mn = (mapnode_t *)pnVar8;
    *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c1085;
    MapData::Read((MapData *)this.Block.Chars,7,pnVar8,-1);
    used = (WORD *)nodes;
    for (k = 0; pmVar6 = mn, k < numnodes; k = k + 1) {
      *(int *)used = (int)(short)no->x << 0x10;
      *(int *)(used + 2) = (int)*(short *)((long)&no->x + 2) << 0x10;
      *(int *)(used + 4) = (int)(short)no->y << 0x10;
      *(int *)(used + 6) = (int)*(short *)((long)&no->y + 2) << 0x10;
      for (local_20 = 0; num = local_20, pnVar8 = no, local_20 < 2; local_20 = local_20 + 1) {
        *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c110b;
        local_84 = mapnode_t::Child((mapnode_t *)pnVar8,num);
        if ((local_84 & 0x8000) == 0) {
          local_68 = local_84;
          if (numnodes <= (int)local_84) {
            uVar7 = (ulong)(uint)k;
            lVar2 = *(long *)(used + (long)local_20 * 4 + 0x1c);
            *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c1211;
            Printf("BSP node %d references invalid node %td.\nThe BSP will be rebuilt.\n",uVar7,
                   (lVar2 - (long)nodes >> 3) * -0x71c71c71c71c71c7);
            ForceNodeBuild = true;
            local_a0 = nodes;
            if (nodes != (node_t *)0x0) {
              *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c123a;
              operator_delete__(nodes);
            }
            pmVar6 = mn;
            local_a8 = mn;
            if (mn != (mapnode_t *)0x0) {
              *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c1257;
              operator_delete__(pmVar6);
            }
            local_64 = 1;
            goto LAB_006c13c6;
          }
          if (*(short *)(puStack_48 + (long)(int)local_84 * 2) != 0) {
            uVar9 = (ulong)(uint)k;
            uVar7 = (ulong)local_84;
            uVar1 = *(ushort *)(puStack_48 + (long)(int)local_84 * 2);
            *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c1293;
            Printf("BSP node %d references node %d,\nwhich is already used by node %d.\nThe BSP will be rebuilt.\n"
                   ,uVar9,uVar7,(ulong)(uVar1 - 1));
            ForceNodeBuild = true;
            local_b0 = nodes;
            if (nodes != (node_t *)0x0) {
              *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c12bc;
              operator_delete__(nodes);
            }
            pmVar6 = mn;
            local_b8 = mn;
            if (mn != (mapnode_t *)0x0) {
              *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c12d9;
              operator_delete__(pmVar6);
            }
            local_64 = 1;
            goto LAB_006c13c6;
          }
          *(node_t **)(used + (long)local_20 * 4 + 0x1c) = nodes + (int)local_84;
          *(short *)(puStack_48 + (long)(int)local_84 * 2) = (short)local_20 + 1;
        }
        else {
          local_68 = local_84 & 0xffff7fff;
          if (child <= (int)local_68) {
            uVar9 = (ulong)(uint)k;
            uVar7 = (ulong)local_68;
            *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c114e;
            Printf("BSP node %d references invalid subsector %d.\nThe BSP will be rebuilt.\n",uVar9,
                   uVar7);
            ForceNodeBuild = true;
            local_90 = nodes;
            if (nodes != (node_t *)0x0) {
              *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c1177;
              operator_delete__(nodes);
            }
            pmVar6 = mn;
            local_98 = mn;
            if (mn != (mapnode_t *)0x0) {
              *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c1194;
              operator_delete__(pmVar6);
            }
            local_64 = 1;
            goto LAB_006c13c6;
          }
          *(undefined1 **)(used + (long)local_20 * 4 + 0x1c) =
               (undefined1 *)((long)&subsectors[(int)local_68].sector + 1);
        }
        for (mnp._4_4_ = 0; mnp._4_4_ < 4; mnp._4_4_ = mnp._4_4_ + 1) {
          *(float *)(used + (long)local_20 * 8 + (long)mnp._4_4_ * 2 + 8) =
               (float)(int)*(short *)((long)&no->dx + (long)mnp._4_4_ * 2 + (long)local_20 * 8);
        }
      }
      used = used + 0x24;
      no = (node_t *)((long)&no->field_4 + 0xc);
    }
    local_c0 = mn;
    if (mn != (mapnode_t *)0x0) {
      *(undefined8 *)(auStack_c8 + lVar5 + -8) = 0x6c13bf;
      operator_delete__(pmVar6);
    }
    local_64 = 0;
  }
LAB_006c13c6:
  *(undefined8 *)(__s + -8) = 0x6c13cf;
  FMemLump::~FMemLump((FMemLump *)&j);
  return;
}

Assistant:

void P_LoadNodes (MapData * map)
{
	FMemLump	data;
	int 		i;
	int 		j;
	int 		k;
	char		*mnp;
	nodetype	*mn;
	node_t* 	no;
	WORD*		used;
	int			lumplen = map->Size(ML_NODES);
	int			maxss = map->Size(ML_SSECTORS) / sizeof(subsectortype);

	numnodes = (lumplen - nodetype::NF_LUMPOFFSET) / sizeof(nodetype);

	if ((numnodes == 0 && maxss != 1) || maxss == 0)
	{
		ForceNodeBuild = true;
		return;
	}
	
	nodes = new node_t[numnodes];		
	used = (WORD *)alloca (sizeof(WORD)*numnodes);
	memset (used, 0, sizeof(WORD)*numnodes);

	mnp = new char[lumplen];
	mn = (nodetype*)(mnp + nodetype::NF_LUMPOFFSET);
	map->Read(ML_NODES, mnp);
	no = nodes;
	
	for (i = 0; i < numnodes; i++, no++, mn++)
	{
		no->x = LittleShort(mn->x)<<FRACBITS;
		no->y = LittleShort(mn->y)<<FRACBITS;
		no->dx = LittleShort(mn->dx)<<FRACBITS;
		no->dy = LittleShort(mn->dy)<<FRACBITS;
		for (j = 0; j < 2; j++)
		{
			int child = mn->Child(j);
			if (child & nodetype::NF_SUBSECTOR)
			{
				child &= ~nodetype::NF_SUBSECTOR;
				if (child >= maxss)
				{
					Printf ("BSP node %d references invalid subsector %d.\n"
						"The BSP will be rebuilt.\n", i, child);
					ForceNodeBuild = true;
					delete[] nodes;
					delete[] mnp;
					return;
				}
				no->children[j] = (BYTE *)&subsectors[child] + 1;
			}
			else if (child >= numnodes)
			{
				Printf ("BSP node %d references invalid node %td.\n"
					"The BSP will be rebuilt.\n", i, (node_t *)no->children[j] - nodes);
				ForceNodeBuild = true;
				delete[] nodes;
				delete[] mnp;
				return;
			}
			else if (used[child])
			{
				Printf ("BSP node %d references node %d,\n"
					"which is already used by node %d.\n"
					"The BSP will be rebuilt.\n", i, child, used[child]-1);
				ForceNodeBuild = true;
				delete[] nodes;
				delete[] mnp;
				return;
			}
			else
			{
				no->children[j] = &nodes[child];
				used[child] = j + 1;
			}
			for (k = 0; k < 4; k++)
			{
				no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
			}
		}
	}
	delete[] mnp;
}